

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

void ef_print(void *p)

{
  undefined8 uVar1;
  char *pcVar2;
  int local_1c;
  int i;
  ef *ef;
  void *p_local;
  
  printf("                    %s  ",*p);
  uVar1 = 99;
  if (*(short *)((long)p + 8) == 0x100) {
    uVar1 = 0x6c;
  }
  printf("%04x %c <",(ulong)*(ushort *)((long)p + 10),uVar1);
  for (local_1c = 0; local_1c < (int)(uint)*(ushort *)((long)p + 0xc); local_1c = local_1c + 1) {
    pcVar2 = "";
    if (local_1c != 0) {
      pcVar2 = " ";
    }
    printf("%s%02x",pcVar2,(ulong)*(byte *)(*(long *)((long)p + 0x10) + (long)local_1c));
  }
  printf(">\n");
  return;
}

Assistant:

static void
ef_print(const void *p) {
    const struct ef *ef = (struct ef *)p;
    int i;

    printf("                    %s  ", ef->name);
    printf("%04x %c <", ef->id, ef->flags == ZIP_FL_LOCAL ? 'l' : 'c');
    for (i = 0; i < ef->size; i++)
	printf("%s%02x", i ? " " : "", ef->data[i]);
    printf(">\n");
}